

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_svc_check_reset_layer_rc_flag(AV1_COMP *cpi)

{
  uint uVar1;
  LAYER_CONTEXT *pLVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  iVar8 = (cpi->svc).number_spatial_layers;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  for (iVar9 = 0; iVar9 != iVar8; iVar9 = iVar9 + 1) {
    uVar1 = (cpi->svc).number_temporal_layers;
    iVar7 = uVar1 * iVar9;
    iVar4 = uVar1 + iVar7 + -1;
    pLVar2 = (cpi->svc).layer_context;
    iVar5 = pLVar2[iVar4].rc.avg_frame_bandwidth;
    iVar4 = pLVar2[iVar4].rc.prev_avg_frame_bandwidth;
    if (iVar4 == 0 || iVar5 == 0) {
      iVar5 = pLVar2[iVar7].rc.avg_frame_bandwidth;
      iVar4 = pLVar2[iVar7].rc.prev_avg_frame_bandwidth;
    }
    if ((iVar4 >> 1 < iVar5 / 3) || (iVar5 < iVar4 >> 1)) {
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar10 = 0;
      }
      for (lVar6 = 0; uVar10 * 0x3380 - lVar6 != 0; lVar6 = lVar6 + 0x3380) {
        *(undefined8 *)((long)pLVar2[iVar7].rc.frame_level_rate_correction_factors + lVar6 + -0x44)
             = 0;
        uVar3 = *(undefined8 *)((long)pLVar2[iVar7].p_rc.avg_frame_qindex + lVar6 + -0x44);
        *(undefined8 *)((long)pLVar2[iVar7].p_rc.q_history + lVar6 + -0x10) = uVar3;
        *(undefined8 *)((long)pLVar2[iVar7].p_rc.rate_correction_factors + lVar6 + 0x30) = uVar3;
      }
    }
  }
  return;
}

Assistant:

void av1_svc_check_reset_layer_rc_flag(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    // Check for reset based on avg_frame_bandwidth for spatial layer sl.
    // If avg_frame_bandwidth for top temporal layer is not set
    // (because enhancement layer was inactive), use the base TL0
    int layer = LAYER_IDS_TO_IDX(sl, svc->number_temporal_layers - 1,
                                 svc->number_temporal_layers);
    LAYER_CONTEXT *lc = &svc->layer_context[layer];
    RATE_CONTROL *lrc = &lc->rc;
    int avg_frame_bandwidth = lrc->avg_frame_bandwidth;
    int prev_avg_frame_bandwidth = lrc->prev_avg_frame_bandwidth;
    if (avg_frame_bandwidth == 0 || prev_avg_frame_bandwidth == 0) {
      // Use base TL0.
      layer = LAYER_IDS_TO_IDX(sl, 0, svc->number_temporal_layers);
      lc = &svc->layer_context[layer];
      lrc = &lc->rc;
      avg_frame_bandwidth = lrc->avg_frame_bandwidth;
      prev_avg_frame_bandwidth = lrc->prev_avg_frame_bandwidth;
    }
    if (avg_frame_bandwidth / 3 > (prev_avg_frame_bandwidth >> 1) ||
        avg_frame_bandwidth < (prev_avg_frame_bandwidth >> 1)) {
      // Reset for all temporal layers with spatial layer sl.
      for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
        int layer2 = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
        LAYER_CONTEXT *lc2 = &svc->layer_context[layer2];
        RATE_CONTROL *lrc2 = &lc2->rc;
        PRIMARY_RATE_CONTROL *lp_rc2 = &lc2->p_rc;
        PRIMARY_RATE_CONTROL *const lp_rc = &lc2->p_rc;
        lrc2->rc_1_frame = 0;
        lrc2->rc_2_frame = 0;
        lp_rc2->bits_off_target = lp_rc->optimal_buffer_level;
        lp_rc2->buffer_level = lp_rc->optimal_buffer_level;
      }
    }
  }
}